

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arrow_wrapper.cpp
# Opt level: O2

void duckdb::ResultArrowArrayStreamWrapper::MyStreamRelease(ArrowArrayStream *stream)

{
  ResultArrowArrayStreamWrapper *this;
  
  if ((stream != (ArrowArrayStream *)0x0) &&
     (stream->release != (_func_void_ArrowArrayStream_ptr *)0x0)) {
    stream->release = (_func_void_ArrowArrayStream_ptr *)0x0;
    this = (ResultArrowArrayStreamWrapper *)stream->private_data;
    if (this != (ResultArrowArrayStreamWrapper *)0x0) {
      ~ResultArrowArrayStreamWrapper(this);
    }
    operator_delete(this);
    return;
  }
  return;
}

Assistant:

void ResultArrowArrayStreamWrapper::MyStreamRelease(struct ArrowArrayStream *stream) {
	if (!stream || !stream->release) {
		return;
	}
	stream->release = nullptr;
	delete reinterpret_cast<ResultArrowArrayStreamWrapper *>(stream->private_data);
}